

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ToolBarLayout::ToolBarLayout(ToolBarLayout *this,QWidget *parent)

{
  QLayout::QLayout(&this->super_QLayout,parent);
  *(undefined ***)this = &PTR_metaObject_00196a08;
  *(undefined ***)&this->field_0x10 = &PTR__ToolBarLayout_00196b18;
  this->left = (QWidgetItem *)0x0;
  this->right = (QWidgetItem *)0x0;
  (this->buttons).d.d = (Data *)0x0;
  (this->buttons).d.ptr = (QLayoutItem **)0x0;
  (this->buttons).d.size = 0;
  this->orient = Horizontal;
  this->align = 1;
  this->offset = 0;
  return;
}

Assistant:

ToolBarLayout::ToolBarLayout( QWidget * parent )
	:	QLayout( parent )
	,	left( 0 )
	,	right( 0 )
	,	orient( Qt::Horizontal )
	,	align( Qt::AlignLeft )
	,	offset( 0 )
{
}